

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O0

void __thiscall Kernel::normalize(Kernel *this)

{
  float *pfVar1;
  Kernel *in_RDI;
  int x;
  int y;
  float sum;
  int x_00;
  int local_14;
  int local_10;
  float local_c;
  
  local_c = 0.0;
  for (local_10 = -in_RDI->height / 2; local_10 <= in_RDI->height / 2; local_10 = local_10 + 1) {
    x_00 = local_10;
    for (local_14 = -in_RDI->width / 2; local_14 <= in_RDI->width / 2; local_14 = local_14 + 1) {
      pfVar1 = operator()(in_RDI,x_00,local_14);
      local_c = *pfVar1 + local_c;
    }
  }
  in_RDI->scale = 1.0 / local_c;
  return;
}

Assistant:

void Kernel::normalize() {
  float sum = 0.0f;
  for (int y = -height / 2; y <= height / 2; y++) {
    for (int x = -width / 2; x <= width / 2; x++) {
      sum += this->operator()(x, y);
    }
  }
  scale = 1 / sum;
}